

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpu_api_mlvec.cpp
# Opt level: O2

MPP_RET vpu_api_mlvec_set_dy_cfg(VpuApiMlvec ctx,VpuApiMlvecDynamicCfg *cfg,MppMeta meta)

{
  uint uVar1;
  MPP_RET MVar2;
  RK_S32 RVar3;
  ulong uVar4;
  
  if ((cfg == (VpuApiMlvecDynamicCfg *)0x0 || ctx == (VpuApiMlvec)0x0) || meta == (MppMeta)0x0) {
    _mpp_log_l(2,"vpu_api_mlvec","invalid NULL input ctx %p cfg %p meta %p\n",
               "vpu_api_mlvec_set_dy_cfg",ctx,cfg,meta);
    MVar2 = MPP_ERR_NULL_PTR;
  }
  else {
    if ((vpu_api_debug._2_1_ & 1) != 0) {
      _mpp_log_l(4,"vpu_api_mlvec","enter ctx %p cfg %p meta %p\n","vpu_api_mlvec_set_dy_cfg",ctx,
                 cfg,meta);
    }
    *(undefined8 *)((long)ctx + 0x60) = 0xffffffffffffffff;
    uVar1 = cfg->updated;
    uVar4 = 0xffffffffffffffff;
    RVar3 = -1;
    if (uVar1 != 0) {
      if ((uVar1 & 2) != 0) {
        RVar3 = cfg->mark_ltr;
        *(RK_S32 *)((long)ctx + 0x60) = RVar3;
      }
      if ((uVar1 & 4) != 0) {
        uVar4 = (ulong)(uint)cfg->use_ltr;
        *(RK_S32 *)((long)ctx + 100) = cfg->use_ltr;
      }
      if ((uVar1 & 8) != 0) {
        *(RK_S32 *)((long)ctx + 0x68) = cfg->frame_qp;
      }
      if ((uVar1 & 0x10) != 0) {
        *(RK_S32 *)((long)ctx + 0x6c) = cfg->base_layer_pid;
      }
      cfg->updated = 0;
    }
    if ((vpu_api_debug._2_1_ & 2) != 0) {
      _mpp_log_l(4,"vpu_api_mlvec","ltr mark %2d use %2d frm qp %2d blpid %d\n",
                 "vpu_api_mlvec_set_dy_cfg",RVar3,uVar4,*(undefined4 *)((long)ctx + 0x68),
                 *(undefined4 *)((long)ctx + 0x6c));
      RVar3 = *(int *)((long)ctx + 0x60);
    }
    if (-1 < RVar3) {
      mpp_meta_set_s32(meta,0x6d6c7472,RVar3);
    }
    if (-1 < *(int *)((long)ctx + 100)) {
      mpp_meta_set_s32(meta,0x756c7472);
    }
    if (-1 < *(int *)((long)ctx + 0x68)) {
      mpp_meta_set_s32(meta,0x66726d71);
    }
    if (-1 < *(int *)((long)ctx + 0x6c)) {
      mpp_meta_set_s32(meta,0x62706964);
    }
    MVar2 = MPP_OK;
    if ((vpu_api_debug._2_1_ & 1) != 0) {
      MVar2 = MPP_OK;
      _mpp_log_l(4,"vpu_api_mlvec","leave ctx %p ret %d\n","vpu_api_mlvec_set_dy_cfg",ctx,0);
    }
  }
  return MVar2;
}

Assistant:

MPP_RET vpu_api_mlvec_set_dy_cfg(VpuApiMlvec ctx, VpuApiMlvecDynamicCfg *cfg, MppMeta meta)
{
    if (NULL == ctx || NULL == cfg || NULL == meta) {
        mpp_err_f("invalid NULL input ctx %p cfg %p meta %p\n",
                  ctx, cfg, meta);
        return MPP_ERR_NULL_PTR;
    }

    mlvec_dbg_func("enter ctx %p cfg %p meta %p\n", ctx, cfg, meta);

    MPP_RET ret = MPP_OK;
    VpuApiMlvecImpl *impl = (VpuApiMlvecImpl *)ctx;
    VpuApiMlvecDynamicCfg *dst = &impl->dy_cfg;

    /* clear non-sticky flag first */
    dst->mark_ltr   = -1;
    dst->use_ltr    = -1;
    /* frame qp and base layer pid is sticky flag */

    /* update flags */
    if (cfg->updated) {
        if (cfg->updated & VPU_API_ENC_MARK_LTR_UPDATED)
            dst->mark_ltr = cfg->mark_ltr;

        if (cfg->updated & VPU_API_ENC_USE_LTR_UPDATED)
            dst->use_ltr = cfg->use_ltr;

        if (cfg->updated & VPU_API_ENC_FRAME_QP_UPDATED)
            dst->frame_qp = cfg->frame_qp;

        if (cfg->updated & VPU_API_ENC_BASE_PID_UPDATED)
            dst->base_layer_pid = cfg->base_layer_pid;

        /* dynamic max temporal layer count updated go through mpp ref cfg */
        cfg->updated = 0;
    }

    mlvec_dbg_flow("ltr mark %2d use %2d frm qp %2d blpid %d\n", dst->mark_ltr,
                   dst->use_ltr, dst->frame_qp, dst->base_layer_pid);

    /* setup next frame configure */
    if (dst->mark_ltr >= 0)
        mpp_meta_set_s32(meta, KEY_ENC_MARK_LTR, dst->mark_ltr);

    if (dst->use_ltr >= 0)
        mpp_meta_set_s32(meta, KEY_ENC_USE_LTR, dst->use_ltr);

    if (dst->frame_qp >= 0)
        mpp_meta_set_s32(meta, KEY_ENC_FRAME_QP, dst->frame_qp);

    if (dst->base_layer_pid >= 0)
        mpp_meta_set_s32(meta, KEY_ENC_BASE_LAYER_PID, dst->base_layer_pid);

    mlvec_dbg_func("leave ctx %p ret %d\n", ctx, ret);

    return ret;
}